

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase130::run(TestCase130 *this)

{
  bool bVar1;
  NullableValue<kj::Exception> *pNVar2;
  Exception *pEVar3;
  Type *in_RDX;
  Type *func;
  Type *func_00;
  Type *func_01;
  Type *func_02;
  Type *func_03;
  Type *func_04;
  Type *func_05;
  Type *func_06;
  Type *func_07;
  Type *func_08;
  Type *func_09;
  Type *func_10;
  Type *func_11;
  Type *func_12;
  Type *func_13;
  ArrayPtr<const_char> AVar4;
  bool local_3099;
  undefined1 auStack_3098 [7];
  bool _kj_shouldLog_31;
  size_t local_3090;
  bool local_3081;
  undefined1 auStack_3080 [7];
  bool _kj_shouldLog_30;
  ArrayPtr<const_char> local_3070;
  kj local_3059;
  Maybe<kj::Exception> local_3058;
  undefined1 local_2ef8 [8];
  NullableValue<kj::Exception> e_15;
  undefined1 auStack_2d90 [7];
  bool _kj_shouldLog_29;
  size_t local_2d88;
  bool local_2d79;
  undefined1 auStack_2d78 [7];
  bool _kj_shouldLog_28;
  ArrayPtr<const_char> local_2d68;
  kj local_2d51;
  Maybe<kj::Exception> local_2d50;
  undefined1 local_2bf0 [8];
  NullableValue<kj::Exception> e_14;
  undefined1 auStack_2a88 [7];
  bool _kj_shouldLog_27;
  size_t local_2a80;
  bool local_2a71;
  undefined1 auStack_2a70 [7];
  bool _kj_shouldLog_26;
  ArrayPtr<const_char> local_2a60;
  kj local_2a49;
  Maybe<kj::Exception> local_2a48;
  undefined1 local_28e8 [8];
  NullableValue<kj::Exception> e_13;
  undefined1 auStack_2780 [7];
  bool _kj_shouldLog_25;
  size_t local_2778;
  bool local_2769;
  undefined1 auStack_2768 [7];
  bool _kj_shouldLog_24;
  ArrayPtr<const_char> local_2758;
  kj local_2741;
  Maybe<kj::Exception> local_2740;
  undefined1 local_25e0 [8];
  NullableValue<kj::Exception> e_12;
  undefined1 auStack_2478 [7];
  bool _kj_shouldLog_23;
  size_t local_2470;
  bool local_2461;
  undefined1 auStack_2460 [7];
  bool _kj_shouldLog_22;
  ArrayPtr<const_char> local_2450;
  kj local_2439;
  Maybe<kj::Exception> local_2438;
  undefined1 local_22d8 [8];
  NullableValue<kj::Exception> e_11;
  undefined1 auStack_2170 [7];
  bool _kj_shouldLog_21;
  size_t local_2168;
  bool local_2159;
  undefined1 auStack_2158 [7];
  bool _kj_shouldLog_20;
  ArrayPtr<const_char> local_2148;
  kj local_2131;
  Maybe<kj::Exception> local_2130;
  undefined1 local_1fd0 [8];
  NullableValue<kj::Exception> e_10;
  undefined1 auStack_1e68 [7];
  bool _kj_shouldLog_19;
  size_t local_1e60;
  bool local_1e51;
  undefined1 auStack_1e50 [7];
  bool _kj_shouldLog_18;
  ArrayPtr<const_char> local_1e40;
  kj local_1e29;
  Maybe<kj::Exception> local_1e28;
  undefined1 local_1cc8 [8];
  NullableValue<kj::Exception> e_9;
  undefined1 auStack_1b60 [7];
  bool _kj_shouldLog_17;
  size_t local_1b58;
  bool local_1b49;
  undefined1 auStack_1b48 [7];
  bool _kj_shouldLog_16;
  ArrayPtr<const_char> local_1b38;
  kj local_1b21;
  Maybe<kj::Exception> local_1b20;
  undefined1 local_19c0 [8];
  NullableValue<kj::Exception> e_8;
  undefined1 auStack_1858 [7];
  bool _kj_shouldLog_15;
  size_t local_1850;
  bool local_1841;
  undefined1 auStack_1840 [7];
  bool _kj_shouldLog_14;
  ArrayPtr<const_char> local_1830;
  kj local_1819;
  Maybe<kj::Exception> local_1818;
  undefined1 local_16b8 [8];
  NullableValue<kj::Exception> e_7;
  undefined1 auStack_1550 [7];
  bool _kj_shouldLog_13;
  size_t local_1548;
  bool local_1539;
  undefined1 auStack_1538 [7];
  bool _kj_shouldLog_12;
  ArrayPtr<const_char> local_1528;
  kj local_1511;
  Maybe<kj::Exception> local_1510;
  undefined1 local_13b0 [8];
  NullableValue<kj::Exception> e_6;
  undefined1 auStack_1248 [7];
  bool _kj_shouldLog_11;
  size_t local_1240;
  bool local_1231;
  undefined1 auStack_1230 [7];
  bool _kj_shouldLog_10;
  ArrayPtr<const_char> local_1220;
  kj local_1209;
  Maybe<kj::Exception> local_1208;
  undefined1 local_10a8 [8];
  NullableValue<kj::Exception> e_5;
  undefined1 auStack_f40 [7];
  bool _kj_shouldLog_9;
  size_t local_f38;
  bool local_f29;
  undefined1 auStack_f28 [7];
  bool _kj_shouldLog_8;
  ArrayPtr<const_char> local_f18;
  kj local_f01;
  Maybe<kj::Exception> local_f00;
  undefined1 local_da0 [8];
  NullableValue<kj::Exception> e_4;
  undefined1 auStack_c38 [7];
  bool _kj_shouldLog_7;
  size_t local_c30;
  bool local_c21;
  undefined1 auStack_c20 [7];
  bool _kj_shouldLog_6;
  ArrayPtr<const_char> local_c10;
  kj local_bf9;
  Maybe<kj::Exception> local_bf8;
  undefined1 local_a98 [8];
  NullableValue<kj::Exception> e_3;
  undefined1 auStack_930 [7];
  bool _kj_shouldLog_5;
  size_t local_928;
  bool local_919;
  undefined1 auStack_918 [7];
  bool _kj_shouldLog_4;
  ArrayPtr<const_char> local_908;
  kj local_8f1;
  Maybe<kj::Exception> local_8f0;
  undefined1 local_790 [8];
  NullableValue<kj::Exception> e_2;
  undefined1 auStack_628 [7];
  bool _kj_shouldLog_3;
  size_t local_620;
  bool local_611;
  undefined1 auStack_610 [7];
  bool _kj_shouldLog_2;
  ArrayPtr<const_char> local_600;
  kj local_5e9;
  Maybe<kj::Exception> local_5e8;
  undefined1 local_488 [8];
  NullableValue<kj::Exception> e_1;
  undefined1 auStack_320 [7];
  bool _kj_shouldLog_1;
  size_t local_318;
  bool local_309;
  undefined1 auStack_308 [7];
  bool _kj_shouldLog;
  ArrayPtr<const_char> local_2f8;
  kj local_2d1;
  Maybe<kj::Exception> local_2d0;
  undefined1 local_170 [8];
  NullableValue<kj::Exception> e;
  TestCase130 *this_local;
  
  e.field_1._336_8_ = this;
  runCatchingExceptions<kj::(anonymous_namespace)::TestCase130::run()::__0>
            (&local_2d0,&local_2d1,in_RDX);
  pNVar2 = _::readMaybe<kj::Exception>(&local_2d0);
  _::NullableValue<kj::Exception>::NullableValue((NullableValue<kj::Exception> *)local_170,pNVar2);
  Maybe<kj::Exception>::~Maybe(&local_2d0);
  pEVar3 = _::NullableValue::operator_cast_to_Exception_((NullableValue *)local_170);
  if (pEVar3 == (Exception *)0x0) {
    e_1.field_1._343_1_ = _::Debug::shouldLog(ERROR);
    while( true ) {
      if (e_1.field_1._343_1_ == '\0') break;
      _::Debug::log<char_const(&)[29]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
                 ,0x83,ERROR,"\"code did not throw: \" \"Path(\\\"\\\")\"",
                 (char (*) [29])"code did not throw: Path(\"\")");
      e_1.field_1._343_1_ = 0;
    }
  }
  else {
    pEVar3 = _::NullableValue<kj::Exception>::operator->((NullableValue<kj::Exception> *)local_170);
    local_2f8 = (ArrayPtr<const_char>)Exception::getDescription(pEVar3);
    StringPtr::StringPtr((StringPtr *)auStack_308,"invalid path component");
    bVar1 = _::hasSubstring((StringPtr)local_2f8,(StringPtr)_auStack_308);
    if (!bVar1) {
      local_309 = _::Debug::shouldLog(ERROR);
      while (local_309 != false) {
        pEVar3 = _::NullableValue<kj::Exception>::operator->
                           ((NullableValue<kj::Exception> *)local_170);
        AVar4 = (ArrayPtr<const_char>)Exception::getDescription(pEVar3);
        _auStack_320 = AVar4;
        _::Debug::log<char_const(&)[86],char_const(&)[56],kj::StringPtr>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
                   ,0x83,ERROR,
                   "\"failed: expected \" \"::kj::_::hasSubstring(e->getDescription(), \\\"invalid path component\\\")\", \"exception description didn\'t contain expected substring\", e->getDescription()"
                   ,(char (*) [86])
                    "failed: expected ::kj::_::hasSubstring(e->getDescription(), \"invalid path component\")"
                   ,(char (*) [56])"exception description didn\'t contain expected substring",
                   (StringPtr *)auStack_320);
        local_309 = false;
      }
    }
  }
  _::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)local_170);
  runCatchingExceptions<kj::(anonymous_namespace)::TestCase130::run()::__1>
            (&local_5e8,&local_5e9,func);
  pNVar2 = _::readMaybe<kj::Exception>(&local_5e8);
  _::NullableValue<kj::Exception>::NullableValue((NullableValue<kj::Exception> *)local_488,pNVar2);
  Maybe<kj::Exception>::~Maybe(&local_5e8);
  pEVar3 = _::NullableValue::operator_cast_to_Exception_((NullableValue *)local_488);
  if (pEVar3 == (Exception *)0x0) {
    e_2.field_1._343_1_ = _::Debug::shouldLog(ERROR);
    while( true ) {
      if (e_2.field_1._343_1_ == '\0') break;
      _::Debug::log<char_const(&)[30]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
                 ,0x84,ERROR,"\"code did not throw: \" \"Path(\\\".\\\")\"",
                 (char (*) [30])"code did not throw: Path(\".\")");
      e_2.field_1._343_1_ = 0;
    }
  }
  else {
    pEVar3 = _::NullableValue<kj::Exception>::operator->((NullableValue<kj::Exception> *)local_488);
    local_600 = (ArrayPtr<const_char>)Exception::getDescription(pEVar3);
    StringPtr::StringPtr((StringPtr *)auStack_610,"invalid path component");
    bVar1 = _::hasSubstring((StringPtr)local_600,(StringPtr)_auStack_610);
    if (!bVar1) {
      local_611 = _::Debug::shouldLog(ERROR);
      while (local_611 != false) {
        pEVar3 = _::NullableValue<kj::Exception>::operator->
                           ((NullableValue<kj::Exception> *)local_488);
        AVar4 = (ArrayPtr<const_char>)Exception::getDescription(pEVar3);
        _auStack_628 = AVar4;
        _::Debug::log<char_const(&)[86],char_const(&)[56],kj::StringPtr>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
                   ,0x84,ERROR,
                   "\"failed: expected \" \"::kj::_::hasSubstring(e->getDescription(), \\\"invalid path component\\\")\", \"exception description didn\'t contain expected substring\", e->getDescription()"
                   ,(char (*) [86])
                    "failed: expected ::kj::_::hasSubstring(e->getDescription(), \"invalid path component\")"
                   ,(char (*) [56])"exception description didn\'t contain expected substring",
                   (StringPtr *)auStack_628);
        local_611 = false;
      }
    }
  }
  _::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)local_488);
  runCatchingExceptions<kj::(anonymous_namespace)::TestCase130::run()::__2>
            (&local_8f0,&local_8f1,func_00);
  pNVar2 = _::readMaybe<kj::Exception>(&local_8f0);
  _::NullableValue<kj::Exception>::NullableValue((NullableValue<kj::Exception> *)local_790,pNVar2);
  Maybe<kj::Exception>::~Maybe(&local_8f0);
  pEVar3 = _::NullableValue::operator_cast_to_Exception_((NullableValue *)local_790);
  if (pEVar3 == (Exception *)0x0) {
    e_3.field_1._343_1_ = _::Debug::shouldLog(ERROR);
    while( true ) {
      if (e_3.field_1._343_1_ == '\0') break;
      _::Debug::log<char_const(&)[31]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
                 ,0x85,ERROR,"\"code did not throw: \" \"Path(\\\"..\\\")\"",
                 (char (*) [31])"code did not throw: Path(\"..\")");
      e_3.field_1._343_1_ = 0;
    }
  }
  else {
    pEVar3 = _::NullableValue<kj::Exception>::operator->((NullableValue<kj::Exception> *)local_790);
    local_908 = (ArrayPtr<const_char>)Exception::getDescription(pEVar3);
    StringPtr::StringPtr((StringPtr *)auStack_918,"invalid path component");
    bVar1 = _::hasSubstring((StringPtr)local_908,(StringPtr)_auStack_918);
    if (!bVar1) {
      local_919 = _::Debug::shouldLog(ERROR);
      while (local_919 != false) {
        pEVar3 = _::NullableValue<kj::Exception>::operator->
                           ((NullableValue<kj::Exception> *)local_790);
        AVar4 = (ArrayPtr<const_char>)Exception::getDescription(pEVar3);
        _auStack_930 = AVar4;
        _::Debug::log<char_const(&)[86],char_const(&)[56],kj::StringPtr>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
                   ,0x85,ERROR,
                   "\"failed: expected \" \"::kj::_::hasSubstring(e->getDescription(), \\\"invalid path component\\\")\", \"exception description didn\'t contain expected substring\", e->getDescription()"
                   ,(char (*) [86])
                    "failed: expected ::kj::_::hasSubstring(e->getDescription(), \"invalid path component\")"
                   ,(char (*) [56])"exception description didn\'t contain expected substring",
                   (StringPtr *)auStack_930);
        local_919 = false;
      }
    }
  }
  _::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)local_790);
  runCatchingExceptions<kj::(anonymous_namespace)::TestCase130::run()::__3>
            (&local_bf8,&local_bf9,func_01);
  pNVar2 = _::readMaybe<kj::Exception>(&local_bf8);
  _::NullableValue<kj::Exception>::NullableValue((NullableValue<kj::Exception> *)local_a98,pNVar2);
  Maybe<kj::Exception>::~Maybe(&local_bf8);
  pEVar3 = _::NullableValue::operator_cast_to_Exception_((NullableValue *)local_a98);
  if (pEVar3 == (Exception *)0x0) {
    e_4.field_1._343_1_ = _::Debug::shouldLog(ERROR);
    while( true ) {
      if (e_4.field_1._343_1_ == '\0') break;
      _::Debug::log<char_const(&)[51]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
                 ,0x86,ERROR,"\"code did not throw: \" \"Path(StringPtr(\\\"foo\\\\0bar\\\", 7))\"",
                 (char (*) [51])"code did not throw: Path(StringPtr(\"foo\\0bar\", 7))");
      e_4.field_1._343_1_ = 0;
    }
  }
  else {
    pEVar3 = _::NullableValue<kj::Exception>::operator->((NullableValue<kj::Exception> *)local_a98);
    local_c10 = (ArrayPtr<const_char>)Exception::getDescription(pEVar3);
    StringPtr::StringPtr((StringPtr *)auStack_c20,"NUL character");
    bVar1 = _::hasSubstring((StringPtr)local_c10,(StringPtr)_auStack_c20);
    if (!bVar1) {
      local_c21 = _::Debug::shouldLog(ERROR);
      while (local_c21 != false) {
        pEVar3 = _::NullableValue<kj::Exception>::operator->
                           ((NullableValue<kj::Exception> *)local_a98);
        AVar4 = (ArrayPtr<const_char>)Exception::getDescription(pEVar3);
        _auStack_c38 = AVar4;
        _::Debug::log<char_const(&)[77],char_const(&)[56],kj::StringPtr>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
                   ,0x86,ERROR,
                   "\"failed: expected \" \"::kj::_::hasSubstring(e->getDescription(), \\\"NUL character\\\")\", \"exception description didn\'t contain expected substring\", e->getDescription()"
                   ,(char (*) [77])
                    "failed: expected ::kj::_::hasSubstring(e->getDescription(), \"NUL character\")"
                   ,(char (*) [56])"exception description didn\'t contain expected substring",
                   (StringPtr *)auStack_c38);
        local_c21 = false;
      }
    }
  }
  _::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)local_a98);
  runCatchingExceptions<kj::(anonymous_namespace)::TestCase130::run()::__4>
            (&local_f00,&local_f01,func_02);
  pNVar2 = _::readMaybe<kj::Exception>(&local_f00);
  _::NullableValue<kj::Exception>::NullableValue((NullableValue<kj::Exception> *)local_da0,pNVar2);
  Maybe<kj::Exception>::~Maybe(&local_f00);
  pEVar3 = _::NullableValue::operator_cast_to_Exception_((NullableValue *)local_da0);
  if (pEVar3 == (Exception *)0x0) {
    e_5.field_1._343_1_ = _::Debug::shouldLog(ERROR);
    while( true ) {
      if (e_5.field_1._343_1_ == '\0') break;
      _::Debug::log<char_const(&)[38]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
                 ,0x88,ERROR,"\"code did not throw: \" \"Path::parse(\\\"..\\\")\"",
                 (char (*) [38])"code did not throw: Path::parse(\"..\")");
      e_5.field_1._343_1_ = 0;
    }
  }
  else {
    pEVar3 = _::NullableValue<kj::Exception>::operator->((NullableValue<kj::Exception> *)local_da0);
    local_f18 = (ArrayPtr<const_char>)Exception::getDescription(pEVar3);
    StringPtr::StringPtr((StringPtr *)auStack_f28,"break out of starting");
    bVar1 = _::hasSubstring((StringPtr)local_f18,(StringPtr)_auStack_f28);
    if (!bVar1) {
      local_f29 = _::Debug::shouldLog(ERROR);
      while (local_f29 != false) {
        pEVar3 = _::NullableValue<kj::Exception>::operator->
                           ((NullableValue<kj::Exception> *)local_da0);
        AVar4 = (ArrayPtr<const_char>)Exception::getDescription(pEVar3);
        _auStack_f40 = AVar4;
        _::Debug::log<char_const(&)[85],char_const(&)[56],kj::StringPtr>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
                   ,0x88,ERROR,
                   "\"failed: expected \" \"::kj::_::hasSubstring(e->getDescription(), \\\"break out of starting\\\")\", \"exception description didn\'t contain expected substring\", e->getDescription()"
                   ,(char (*) [85])
                    "failed: expected ::kj::_::hasSubstring(e->getDescription(), \"break out of starting\")"
                   ,(char (*) [56])"exception description didn\'t contain expected substring",
                   (StringPtr *)auStack_f40);
        local_f29 = false;
      }
    }
  }
  _::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)local_da0);
  runCatchingExceptions<kj::(anonymous_namespace)::TestCase130::run()::__5>
            (&local_1208,&local_1209,func_03);
  pNVar2 = _::readMaybe<kj::Exception>(&local_1208);
  _::NullableValue<kj::Exception>::NullableValue((NullableValue<kj::Exception> *)local_10a8,pNVar2);
  Maybe<kj::Exception>::~Maybe(&local_1208);
  pEVar3 = _::NullableValue::operator_cast_to_Exception_((NullableValue *)local_10a8);
  if (pEVar3 == (Exception *)0x0) {
    e_6.field_1._343_1_ = _::Debug::shouldLog(ERROR);
    while( true ) {
      if (e_6.field_1._343_1_ == '\0') break;
      _::Debug::log<char_const(&)[42]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
                 ,0x89,ERROR,"\"code did not throw: \" \"Path::parse(\\\"../foo\\\")\"",
                 (char (*) [42])"code did not throw: Path::parse(\"../foo\")");
      e_6.field_1._343_1_ = 0;
    }
  }
  else {
    pEVar3 = _::NullableValue<kj::Exception>::operator->((NullableValue<kj::Exception> *)local_10a8)
    ;
    local_1220 = (ArrayPtr<const_char>)Exception::getDescription(pEVar3);
    StringPtr::StringPtr((StringPtr *)auStack_1230,"break out of starting");
    bVar1 = _::hasSubstring((StringPtr)local_1220,(StringPtr)_auStack_1230);
    if (!bVar1) {
      local_1231 = _::Debug::shouldLog(ERROR);
      while (local_1231 != false) {
        pEVar3 = _::NullableValue<kj::Exception>::operator->
                           ((NullableValue<kj::Exception> *)local_10a8);
        AVar4 = (ArrayPtr<const_char>)Exception::getDescription(pEVar3);
        _auStack_1248 = AVar4;
        _::Debug::log<char_const(&)[85],char_const(&)[56],kj::StringPtr>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
                   ,0x89,ERROR,
                   "\"failed: expected \" \"::kj::_::hasSubstring(e->getDescription(), \\\"break out of starting\\\")\", \"exception description didn\'t contain expected substring\", e->getDescription()"
                   ,(char (*) [85])
                    "failed: expected ::kj::_::hasSubstring(e->getDescription(), \"break out of starting\")"
                   ,(char (*) [56])"exception description didn\'t contain expected substring",
                   (StringPtr *)auStack_1248);
        local_1231 = false;
      }
    }
  }
  _::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)local_10a8);
  runCatchingExceptions<kj::(anonymous_namespace)::TestCase130::run()::__6>
            (&local_1510,&local_1511,func_04);
  pNVar2 = _::readMaybe<kj::Exception>(&local_1510);
  _::NullableValue<kj::Exception>::NullableValue((NullableValue<kj::Exception> *)local_13b0,pNVar2);
  Maybe<kj::Exception>::~Maybe(&local_1510);
  pEVar3 = _::NullableValue::operator_cast_to_Exception_((NullableValue *)local_13b0);
  if (pEVar3 == (Exception *)0x0) {
    e_7.field_1._343_1_ = _::Debug::shouldLog(ERROR);
    while( true ) {
      if (e_7.field_1._343_1_ == '\0') break;
      _::Debug::log<char_const(&)[45]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
                 ,0x8a,ERROR,"\"code did not throw: \" \"Path::parse(\\\"foo/../..\\\")\"",
                 (char (*) [45])"code did not throw: Path::parse(\"foo/../..\")");
      e_7.field_1._343_1_ = 0;
    }
  }
  else {
    pEVar3 = _::NullableValue<kj::Exception>::operator->((NullableValue<kj::Exception> *)local_13b0)
    ;
    local_1528 = (ArrayPtr<const_char>)Exception::getDescription(pEVar3);
    StringPtr::StringPtr((StringPtr *)auStack_1538,"break out of starting");
    bVar1 = _::hasSubstring((StringPtr)local_1528,(StringPtr)_auStack_1538);
    if (!bVar1) {
      local_1539 = _::Debug::shouldLog(ERROR);
      while (local_1539 != false) {
        pEVar3 = _::NullableValue<kj::Exception>::operator->
                           ((NullableValue<kj::Exception> *)local_13b0);
        AVar4 = (ArrayPtr<const_char>)Exception::getDescription(pEVar3);
        _auStack_1550 = AVar4;
        _::Debug::log<char_const(&)[85],char_const(&)[56],kj::StringPtr>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
                   ,0x8a,ERROR,
                   "\"failed: expected \" \"::kj::_::hasSubstring(e->getDescription(), \\\"break out of starting\\\")\", \"exception description didn\'t contain expected substring\", e->getDescription()"
                   ,(char (*) [85])
                    "failed: expected ::kj::_::hasSubstring(e->getDescription(), \"break out of starting\")"
                   ,(char (*) [56])"exception description didn\'t contain expected substring",
                   (StringPtr *)auStack_1550);
        local_1539 = false;
      }
    }
  }
  _::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)local_13b0);
  runCatchingExceptions<kj::(anonymous_namespace)::TestCase130::run()::__7>
            (&local_1818,&local_1819,func_05);
  pNVar2 = _::readMaybe<kj::Exception>(&local_1818);
  _::NullableValue<kj::Exception>::NullableValue((NullableValue<kj::Exception> *)local_16b8,pNVar2);
  Maybe<kj::Exception>::~Maybe(&local_1818);
  pEVar3 = _::NullableValue::operator_cast_to_Exception_((NullableValue *)local_16b8);
  if (pEVar3 == (Exception *)0x0) {
    e_8.field_1._343_1_ = _::Debug::shouldLog(ERROR);
    while( true ) {
      if (e_8.field_1._343_1_ == '\0') break;
      _::Debug::log<char_const(&)[40]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
                 ,0x8b,ERROR,"\"code did not throw: \" \"Path::parse(\\\"/foo\\\")\"",
                 (char (*) [40])"code did not throw: Path::parse(\"/foo\")");
      e_8.field_1._343_1_ = 0;
    }
  }
  else {
    pEVar3 = _::NullableValue<kj::Exception>::operator->((NullableValue<kj::Exception> *)local_16b8)
    ;
    local_1830 = (ArrayPtr<const_char>)Exception::getDescription(pEVar3);
    StringPtr::StringPtr((StringPtr *)auStack_1840,"expected a relative path");
    bVar1 = _::hasSubstring((StringPtr)local_1830,(StringPtr)_auStack_1840);
    if (!bVar1) {
      local_1841 = _::Debug::shouldLog(ERROR);
      while (local_1841 != false) {
        pEVar3 = _::NullableValue<kj::Exception>::operator->
                           ((NullableValue<kj::Exception> *)local_16b8);
        AVar4 = (ArrayPtr<const_char>)Exception::getDescription(pEVar3);
        _auStack_1858 = AVar4;
        _::Debug::log<char_const(&)[88],char_const(&)[56],kj::StringPtr>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
                   ,0x8b,ERROR,
                   "\"failed: expected \" \"::kj::_::hasSubstring(e->getDescription(), \\\"expected a relative path\\\")\", \"exception description didn\'t contain expected substring\", e->getDescription()"
                   ,(char (*) [88])
                    "failed: expected ::kj::_::hasSubstring(e->getDescription(), \"expected a relative path\")"
                   ,(char (*) [56])"exception description didn\'t contain expected substring",
                   (StringPtr *)auStack_1858);
        local_1841 = false;
      }
    }
  }
  _::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)local_16b8);
  runCatchingExceptions<kj::(anonymous_namespace)::TestCase130::run()::__8>
            (&local_1b20,&local_1b21,func_06);
  pNVar2 = _::readMaybe<kj::Exception>(&local_1b20);
  _::NullableValue<kj::Exception>::NullableValue((NullableValue<kj::Exception> *)local_19c0,pNVar2);
  Maybe<kj::Exception>::~Maybe(&local_1b20);
  pEVar3 = _::NullableValue::operator_cast_to_Exception_((NullableValue *)local_19c0);
  if (pEVar3 == (Exception *)0x0) {
    e_9.field_1._343_1_ = _::Debug::shouldLog(ERROR);
    while( true ) {
      if (e_9.field_1._343_1_ == '\0') break;
      _::Debug::log<char_const(&)[62]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
                 ,0x8d,ERROR,
                 "\"code did not throw: \" \"Path::parse(kj::StringPtr(\\\"foo\\\\0bar\\\", 7))\"",
                 (char (*) [62])"code did not throw: Path::parse(kj::StringPtr(\"foo\\0bar\", 7))");
      e_9.field_1._343_1_ = 0;
    }
  }
  else {
    pEVar3 = _::NullableValue<kj::Exception>::operator->((NullableValue<kj::Exception> *)local_19c0)
    ;
    local_1b38 = (ArrayPtr<const_char>)Exception::getDescription(pEVar3);
    StringPtr::StringPtr((StringPtr *)auStack_1b48,"NUL character");
    bVar1 = _::hasSubstring((StringPtr)local_1b38,(StringPtr)_auStack_1b48);
    if (!bVar1) {
      local_1b49 = _::Debug::shouldLog(ERROR);
      while (local_1b49 != false) {
        pEVar3 = _::NullableValue<kj::Exception>::operator->
                           ((NullableValue<kj::Exception> *)local_19c0);
        AVar4 = (ArrayPtr<const_char>)Exception::getDescription(pEVar3);
        _auStack_1b60 = AVar4;
        _::Debug::log<char_const(&)[77],char_const(&)[56],kj::StringPtr>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
                   ,0x8d,ERROR,
                   "\"failed: expected \" \"::kj::_::hasSubstring(e->getDescription(), \\\"NUL character\\\")\", \"exception description didn\'t contain expected substring\", e->getDescription()"
                   ,(char (*) [77])
                    "failed: expected ::kj::_::hasSubstring(e->getDescription(), \"NUL character\")"
                   ,(char (*) [56])"exception description didn\'t contain expected substring",
                   (StringPtr *)auStack_1b60);
        local_1b49 = false;
      }
    }
  }
  _::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)local_19c0);
  runCatchingExceptions<kj::(anonymous_namespace)::TestCase130::run()::__9>
            (&local_1e28,&local_1e29,func_07);
  pNVar2 = _::readMaybe<kj::Exception>(&local_1e28);
  _::NullableValue<kj::Exception>::NullableValue((NullableValue<kj::Exception> *)local_1cc8,pNVar2);
  Maybe<kj::Exception>::~Maybe(&local_1e28);
  pEVar3 = _::NullableValue::operator_cast_to_Exception_((NullableValue *)local_1cc8);
  if (pEVar3 == (Exception *)0x0) {
    e_10.field_1._343_1_ = _::Debug::shouldLog(ERROR);
    while( true ) {
      if (e_10.field_1._343_1_ == '\0') break;
      _::Debug::log<char_const(&)[58]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
                 ,0x90,ERROR,
                 "\"code did not throw: \" \"Path({\\\"foo\\\", \\\"bar\\\"}).eval(\\\"../../..\\\")\""
                 ,(char (*) [58])"code did not throw: Path({\"foo\", \"bar\"}).eval(\"../../..\")");
      e_10.field_1._343_1_ = 0;
    }
  }
  else {
    pEVar3 = _::NullableValue<kj::Exception>::operator->((NullableValue<kj::Exception> *)local_1cc8)
    ;
    local_1e40 = (ArrayPtr<const_char>)Exception::getDescription(pEVar3);
    StringPtr::StringPtr((StringPtr *)auStack_1e50,"break out of starting");
    bVar1 = _::hasSubstring((StringPtr)local_1e40,(StringPtr)_auStack_1e50);
    if (!bVar1) {
      local_1e51 = _::Debug::shouldLog(ERROR);
      while (local_1e51 != false) {
        pEVar3 = _::NullableValue<kj::Exception>::operator->
                           ((NullableValue<kj::Exception> *)local_1cc8);
        AVar4 = (ArrayPtr<const_char>)Exception::getDescription(pEVar3);
        _auStack_1e68 = AVar4;
        _::Debug::log<char_const(&)[85],char_const(&)[56],kj::StringPtr>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
                   ,0x90,ERROR,
                   "\"failed: expected \" \"::kj::_::hasSubstring(e->getDescription(), \\\"break out of starting\\\")\", \"exception description didn\'t contain expected substring\", e->getDescription()"
                   ,(char (*) [85])
                    "failed: expected ::kj::_::hasSubstring(e->getDescription(), \"break out of starting\")"
                   ,(char (*) [56])"exception description didn\'t contain expected substring",
                   (StringPtr *)auStack_1e68);
        local_1e51 = false;
      }
    }
  }
  _::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)local_1cc8);
  runCatchingExceptions<kj::(anonymous_namespace)::TestCase130::run()::__10>
            (&local_2130,&local_2131,func_08);
  pNVar2 = _::readMaybe<kj::Exception>(&local_2130);
  _::NullableValue<kj::Exception>::NullableValue((NullableValue<kj::Exception> *)local_1fd0,pNVar2);
  Maybe<kj::Exception>::~Maybe(&local_2130);
  pEVar3 = _::NullableValue::operator_cast_to_Exception_((NullableValue *)local_1fd0);
  if (pEVar3 == (Exception *)0x0) {
    e_11.field_1._343_1_ = _::Debug::shouldLog(ERROR);
    while( true ) {
      if (e_11.field_1._343_1_ == '\0') break;
      _::Debug::log<char_const(&)[65]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
                 ,0x92,ERROR,
                 "\"code did not throw: \" \"Path({\\\"foo\\\", \\\"bar\\\"}).eval(\\\"../baz/../../..\\\")\""
                 ,(char (*) [65])
                  "code did not throw: Path({\"foo\", \"bar\"}).eval(\"../baz/../../..\")");
      e_11.field_1._343_1_ = 0;
    }
  }
  else {
    pEVar3 = _::NullableValue<kj::Exception>::operator->((NullableValue<kj::Exception> *)local_1fd0)
    ;
    local_2148 = (ArrayPtr<const_char>)Exception::getDescription(pEVar3);
    StringPtr::StringPtr((StringPtr *)auStack_2158,"break out of starting");
    bVar1 = _::hasSubstring((StringPtr)local_2148,(StringPtr)_auStack_2158);
    if (!bVar1) {
      local_2159 = _::Debug::shouldLog(ERROR);
      while (local_2159 != false) {
        pEVar3 = _::NullableValue<kj::Exception>::operator->
                           ((NullableValue<kj::Exception> *)local_1fd0);
        AVar4 = (ArrayPtr<const_char>)Exception::getDescription(pEVar3);
        _auStack_2170 = AVar4;
        _::Debug::log<char_const(&)[85],char_const(&)[56],kj::StringPtr>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
                   ,0x92,ERROR,
                   "\"failed: expected \" \"::kj::_::hasSubstring(e->getDescription(), \\\"break out of starting\\\")\", \"exception description didn\'t contain expected substring\", e->getDescription()"
                   ,(char (*) [85])
                    "failed: expected ::kj::_::hasSubstring(e->getDescription(), \"break out of starting\")"
                   ,(char (*) [56])"exception description didn\'t contain expected substring",
                   (StringPtr *)auStack_2170);
        local_2159 = false;
      }
    }
  }
  _::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)local_1fd0);
  runCatchingExceptions<kj::(anonymous_namespace)::TestCase130::run()::__11>
            (&local_2438,&local_2439,func_09);
  pNVar2 = _::readMaybe<kj::Exception>(&local_2438);
  _::NullableValue<kj::Exception>::NullableValue((NullableValue<kj::Exception> *)local_22d8,pNVar2);
  Maybe<kj::Exception>::~Maybe(&local_2438);
  pEVar3 = _::NullableValue::operator_cast_to_Exception_((NullableValue *)local_22d8);
  if (pEVar3 == (Exception *)0x0) {
    e_12.field_1._343_1_ = _::Debug::shouldLog(ERROR);
    while( true ) {
      if (e_12.field_1._343_1_ == '\0') break;
      _::Debug::log<char_const(&)[65]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
                 ,0x94,ERROR,
                 "\"code did not throw: \" \"Path({\\\"foo\\\", \\\"bar\\\"}).eval(\\\"baz/../../../..\\\")\""
                 ,(char (*) [65])
                  "code did not throw: Path({\"foo\", \"bar\"}).eval(\"baz/../../../..\")");
      e_12.field_1._343_1_ = 0;
    }
  }
  else {
    pEVar3 = _::NullableValue<kj::Exception>::operator->((NullableValue<kj::Exception> *)local_22d8)
    ;
    local_2450 = (ArrayPtr<const_char>)Exception::getDescription(pEVar3);
    StringPtr::StringPtr((StringPtr *)auStack_2460,"break out of starting");
    bVar1 = _::hasSubstring((StringPtr)local_2450,(StringPtr)_auStack_2460);
    if (!bVar1) {
      local_2461 = _::Debug::shouldLog(ERROR);
      while (local_2461 != false) {
        pEVar3 = _::NullableValue<kj::Exception>::operator->
                           ((NullableValue<kj::Exception> *)local_22d8);
        AVar4 = (ArrayPtr<const_char>)Exception::getDescription(pEVar3);
        _auStack_2478 = AVar4;
        _::Debug::log<char_const(&)[85],char_const(&)[56],kj::StringPtr>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
                   ,0x94,ERROR,
                   "\"failed: expected \" \"::kj::_::hasSubstring(e->getDescription(), \\\"break out of starting\\\")\", \"exception description didn\'t contain expected substring\", e->getDescription()"
                   ,(char (*) [85])
                    "failed: expected ::kj::_::hasSubstring(e->getDescription(), \"break out of starting\")"
                   ,(char (*) [56])"exception description didn\'t contain expected substring",
                   (StringPtr *)auStack_2478);
        local_2461 = false;
      }
    }
  }
  _::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)local_22d8);
  runCatchingExceptions<kj::(anonymous_namespace)::TestCase130::run()::__12>
            (&local_2740,&local_2741,func_10);
  pNVar2 = _::readMaybe<kj::Exception>(&local_2740);
  _::NullableValue<kj::Exception>::NullableValue((NullableValue<kj::Exception> *)local_25e0,pNVar2);
  Maybe<kj::Exception>::~Maybe(&local_2740);
  pEVar3 = _::NullableValue::operator_cast_to_Exception_((NullableValue *)local_25e0);
  if (pEVar3 == (Exception *)0x0) {
    e_13.field_1._343_1_ = _::Debug::shouldLog(ERROR);
    while( true ) {
      if (e_13.field_1._343_1_ == '\0') break;
      _::Debug::log<char_const(&)[53]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
                 ,0x96,ERROR,
                 "\"code did not throw: \" \"Path({\\\"foo\\\", \\\"bar\\\"}).eval(\\\"/..\\\")\"",
                 (char (*) [53])"code did not throw: Path({\"foo\", \"bar\"}).eval(\"/..\")");
      e_13.field_1._343_1_ = 0;
    }
  }
  else {
    pEVar3 = _::NullableValue<kj::Exception>::operator->((NullableValue<kj::Exception> *)local_25e0)
    ;
    local_2758 = (ArrayPtr<const_char>)Exception::getDescription(pEVar3);
    StringPtr::StringPtr((StringPtr *)auStack_2768,"break out of starting");
    bVar1 = _::hasSubstring((StringPtr)local_2758,(StringPtr)_auStack_2768);
    if (!bVar1) {
      local_2769 = _::Debug::shouldLog(ERROR);
      while (local_2769 != false) {
        pEVar3 = _::NullableValue<kj::Exception>::operator->
                           ((NullableValue<kj::Exception> *)local_25e0);
        AVar4 = (ArrayPtr<const_char>)Exception::getDescription(pEVar3);
        _auStack_2780 = AVar4;
        _::Debug::log<char_const(&)[85],char_const(&)[56],kj::StringPtr>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
                   ,0x96,ERROR,
                   "\"failed: expected \" \"::kj::_::hasSubstring(e->getDescription(), \\\"break out of starting\\\")\", \"exception description didn\'t contain expected substring\", e->getDescription()"
                   ,(char (*) [85])
                    "failed: expected ::kj::_::hasSubstring(e->getDescription(), \"break out of starting\")"
                   ,(char (*) [56])"exception description didn\'t contain expected substring",
                   (StringPtr *)auStack_2780);
        local_2769 = false;
      }
    }
  }
  _::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)local_25e0);
  runCatchingExceptions<kj::(anonymous_namespace)::TestCase130::run()::__13>
            (&local_2a48,&local_2a49,func_11);
  pNVar2 = _::readMaybe<kj::Exception>(&local_2a48);
  _::NullableValue<kj::Exception>::NullableValue((NullableValue<kj::Exception> *)local_28e8,pNVar2);
  Maybe<kj::Exception>::~Maybe(&local_2a48);
  pEVar3 = _::NullableValue::operator_cast_to_Exception_((NullableValue *)local_28e8);
  if (pEVar3 == (Exception *)0x0) {
    e_14.field_1._343_1_ = _::Debug::shouldLog(ERROR);
    while( true ) {
      if (e_14.field_1._343_1_ == '\0') break;
      _::Debug::log<char_const(&)[60]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
                 ,0x98,ERROR,
                 "\"code did not throw: \" \"Path({\\\"foo\\\", \\\"bar\\\"}).eval(\\\"/baz/../..\\\")\""
                 ,(char (*) [60])"code did not throw: Path({\"foo\", \"bar\"}).eval(\"/baz/../..\")"
                );
      e_14.field_1._343_1_ = 0;
    }
  }
  else {
    pEVar3 = _::NullableValue<kj::Exception>::operator->((NullableValue<kj::Exception> *)local_28e8)
    ;
    local_2a60 = (ArrayPtr<const_char>)Exception::getDescription(pEVar3);
    StringPtr::StringPtr((StringPtr *)auStack_2a70,"break out of starting");
    bVar1 = _::hasSubstring((StringPtr)local_2a60,(StringPtr)_auStack_2a70);
    if (!bVar1) {
      local_2a71 = _::Debug::shouldLog(ERROR);
      while (local_2a71 != false) {
        pEVar3 = _::NullableValue<kj::Exception>::operator->
                           ((NullableValue<kj::Exception> *)local_28e8);
        AVar4 = (ArrayPtr<const_char>)Exception::getDescription(pEVar3);
        _auStack_2a88 = AVar4;
        _::Debug::log<char_const(&)[85],char_const(&)[56],kj::StringPtr>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
                   ,0x98,ERROR,
                   "\"failed: expected \" \"::kj::_::hasSubstring(e->getDescription(), \\\"break out of starting\\\")\", \"exception description didn\'t contain expected substring\", e->getDescription()"
                   ,(char (*) [85])
                    "failed: expected ::kj::_::hasSubstring(e->getDescription(), \"break out of starting\")"
                   ,(char (*) [56])"exception description didn\'t contain expected substring",
                   (StringPtr *)auStack_2a88);
        local_2a71 = false;
      }
    }
  }
  _::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)local_28e8);
  runCatchingExceptions<kj::(anonymous_namespace)::TestCase130::run()::__14>
            (&local_2d50,&local_2d51,func_12);
  pNVar2 = _::readMaybe<kj::Exception>(&local_2d50);
  _::NullableValue<kj::Exception>::NullableValue((NullableValue<kj::Exception> *)local_2bf0,pNVar2);
  Maybe<kj::Exception>::~Maybe(&local_2d50);
  pEVar3 = _::NullableValue::operator_cast_to_Exception_((NullableValue *)local_2bf0);
  if (pEVar3 == (Exception *)0x0) {
    e_15.field_1._343_1_ = _::Debug::shouldLog(ERROR);
    while( true ) {
      if (e_15.field_1._343_1_ == '\0') break;
      _::Debug::log<char_const(&)[45]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
                 ,0x9a,ERROR,"\"code did not throw: \" \"Path(nullptr).basename()\"",
                 (char (*) [45])"code did not throw: Path(nullptr).basename()");
      e_15.field_1._343_1_ = 0;
    }
  }
  else {
    pEVar3 = _::NullableValue<kj::Exception>::operator->((NullableValue<kj::Exception> *)local_2bf0)
    ;
    local_2d68 = (ArrayPtr<const_char>)Exception::getDescription(pEVar3);
    StringPtr::StringPtr((StringPtr *)auStack_2d78,"root path has no basename");
    bVar1 = _::hasSubstring((StringPtr)local_2d68,(StringPtr)_auStack_2d78);
    if (!bVar1) {
      local_2d79 = _::Debug::shouldLog(ERROR);
      while (local_2d79 != false) {
        pEVar3 = _::NullableValue<kj::Exception>::operator->
                           ((NullableValue<kj::Exception> *)local_2bf0);
        AVar4 = (ArrayPtr<const_char>)Exception::getDescription(pEVar3);
        _auStack_2d90 = AVar4;
        _::Debug::log<char_const(&)[89],char_const(&)[56],kj::StringPtr>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
                   ,0x9a,ERROR,
                   "\"failed: expected \" \"::kj::_::hasSubstring(e->getDescription(), \\\"root path has no basename\\\")\", \"exception description didn\'t contain expected substring\", e->getDescription()"
                   ,(char (*) [89])
                    "failed: expected ::kj::_::hasSubstring(e->getDescription(), \"root path has no basename\")"
                   ,(char (*) [56])"exception description didn\'t contain expected substring",
                   (StringPtr *)auStack_2d90);
        local_2d79 = false;
      }
    }
  }
  _::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)local_2bf0);
  runCatchingExceptions<kj::(anonymous_namespace)::TestCase130::run()::__15>
            (&local_3058,&local_3059,func_13);
  pNVar2 = _::readMaybe<kj::Exception>(&local_3058);
  _::NullableValue<kj::Exception>::NullableValue((NullableValue<kj::Exception> *)local_2ef8,pNVar2);
  Maybe<kj::Exception>::~Maybe(&local_3058);
  pEVar3 = _::NullableValue::operator_cast_to_Exception_((NullableValue *)local_2ef8);
  if (pEVar3 == (Exception *)0x0) {
    local_3099 = _::Debug::shouldLog(ERROR);
    while( true ) {
      if (local_3099 == false) break;
      _::Debug::log<char_const(&)[43]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
                 ,0x9b,ERROR,"\"code did not throw: \" \"Path(nullptr).parent()\"",
                 (char (*) [43])"code did not throw: Path(nullptr).parent()");
      local_3099 = false;
    }
  }
  else {
    pEVar3 = _::NullableValue<kj::Exception>::operator->((NullableValue<kj::Exception> *)local_2ef8)
    ;
    local_3070 = (ArrayPtr<const_char>)Exception::getDescription(pEVar3);
    StringPtr::StringPtr((StringPtr *)auStack_3080,"root path has no parent");
    bVar1 = _::hasSubstring((StringPtr)local_3070,(StringPtr)_auStack_3080);
    if (!bVar1) {
      local_3081 = _::Debug::shouldLog(ERROR);
      while (local_3081 != false) {
        pEVar3 = _::NullableValue<kj::Exception>::operator->
                           ((NullableValue<kj::Exception> *)local_2ef8);
        AVar4 = (ArrayPtr<const_char>)Exception::getDescription(pEVar3);
        _auStack_3098 = AVar4;
        _::Debug::log<char_const(&)[87],char_const(&)[56],kj::StringPtr>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
                   ,0x9b,ERROR,
                   "\"failed: expected \" \"::kj::_::hasSubstring(e->getDescription(), \\\"root path has no parent\\\")\", \"exception description didn\'t contain expected substring\", e->getDescription()"
                   ,(char (*) [87])
                    "failed: expected ::kj::_::hasSubstring(e->getDescription(), \"root path has no parent\")"
                   ,(char (*) [56])"exception description didn\'t contain expected substring",
                   (StringPtr *)auStack_3098);
        local_3081 = false;
      }
    }
  }
  _::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)local_2ef8);
  return;
}

Assistant:

TEST(Async, PropagateExceptionTypeChange) {
  EventLoop loop;
  WaitScope waitScope(loop);

  Promise<int> promise = evalLater(
      [&]() -> int { KJ_FAIL_ASSERT("foo") { return 123; } });
  int line = __LINE__ - 1;

  Promise<StringPtr> promise2 = promise.then([](int i) -> StringPtr { return "foo"; });

  promise2 = promise2.then(
      [](StringPtr s) -> StringPtr { return "bar"; },
      [&](Exception&& e) -> StringPtr { EXPECT_EQ(line, e.getLine()); return "baz"; });

  EXPECT_EQ("baz", promise2.wait(waitScope));
}